

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O1

bool __thiscall
xray_re::xr_file_system::copy_file(xr_file_system *this,char *src_path,char *tgt_path)

{
  char cVar1;
  undefined1 uVar2;
  _Alloc_hider _Var3;
  CPath to;
  CPath from;
  path local_60;
  path local_38;
  char *local_10;
  
  if ((this->m_flags & 1) == 0) {
    local_60._M_pathname._M_dataplus._M_p = src_path;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_38,(char **)&local_60,auto_format);
    local_10 = tgt_path;
    std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
              (&local_60,&local_10,auto_format);
    do {
      if (*local_38._M_pathname._M_dataplus._M_p == '\\') {
        *local_38._M_pathname._M_dataplus._M_p = '/';
      }
      cVar1 = *local_38._M_pathname._M_dataplus._M_p;
      local_38._M_pathname._M_dataplus._M_p = local_38._M_pathname._M_dataplus._M_p + 1;
      _Var3._M_p = local_60._M_pathname._M_dataplus._M_p;
    } while (cVar1 != '\0');
    do {
      if (*_Var3._M_p == '\\') {
        *_Var3._M_p = '/';
      }
      cVar1 = *_Var3._M_p;
      _Var3._M_p = _Var3._M_p + 1;
    } while (cVar1 != '\0');
    uVar2 = std::filesystem::copy_file(&local_38,&local_60,none);
    std::filesystem::__cxx11::path::~path(&local_60);
    std::filesystem::__cxx11::path::~path(&local_38);
  }
  else {
    dbg("fs_ro: copying %s to %s",src_path,tgt_path);
    uVar2 = 1;
  }
  return (bool)uVar2;
}

Assistant:

bool xr_file_system::copy_file(const char* src_path, const char* tgt_path) const
{
	if(read_only())
	{
		dbg("fs_ro: copying %s to %s", src_path, tgt_path);

		return true;
	}
	else
	{
		CPath from(src_path), to(tgt_path);

		from.make_preferred();
		to.make_preferred();

		return fs::copy_file(from, to);
	}
}